

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak.cpp
# Opt level: O1

void xmrig::keccak(uint8_t *in,int inlen,uint8_t *md,int mdlen)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  state_t st;
  uint8_t temp [144];
  uint64_t local_198 [25];
  byte bStack_c9;
  undefined8 local_c8;
  
  iVar3 = 0x88;
  if (mdlen != 200) {
    iVar3 = mdlen * -2 + 200;
  }
  iVar4 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  memset(local_198,0,200);
  if (iVar3 <= inlen) {
    do {
      if (7 < iVar3) {
        uVar2 = 0;
        do {
          local_198[uVar2] = local_198[uVar2] ^ *(ulong *)(in + uVar2 * 8);
          uVar2 = uVar2 + 1;
        } while ((uint)(iVar4 >> 3) != uVar2);
      }
      keccakf(local_198,0x18);
      inlen = inlen - iVar3;
      in = in + iVar3;
    } while (iVar3 <= inlen);
  }
  __n = (size_t)inlen;
  memcpy(&local_c8,in,__n);
  *(undefined1 *)((long)&local_c8 + __n) = 1;
  memset((void *)((long)&local_c8 + __n + 1),0,(long)(~inlen + iVar3));
  pbVar1 = (byte *)((long)iVar3 + -1 + (long)&local_c8);
  *pbVar1 = *pbVar1 | 0x80;
  if (7 < iVar3) {
    uVar2 = 0;
    do {
      local_198[uVar2] = local_198[uVar2] ^ (&local_c8)[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)(iVar4 >> 3) != uVar2);
  }
  keccakf(local_198,0x18);
  memcpy(md,local_198,(long)mdlen);
  return;
}

Assistant:

void xmrig::keccak(const uint8_t *in, int inlen, uint8_t *md, int mdlen)
{
    state_t st;
    uint8_t temp[144];
    int i, rsiz, rsizw;

    rsiz = sizeof(state_t) == mdlen ? HASH_DATA_AREA : 200 - 2 * mdlen;
    rsizw = rsiz / 8;
    
    memset(st, 0, sizeof(st));

    for ( ; inlen >= rsiz; inlen -= rsiz, in += rsiz) {
        for (i = 0; i < rsizw; i++) {
            st[i] ^= ((uint64_t *) in)[i];
        }

        xmrig::keccakf(st, KECCAK_ROUNDS);
    }

    // last block and padding
    memcpy(temp, in, inlen);
    temp[inlen++] = 1;
    memset(temp + inlen, 0, rsiz - inlen);
    temp[rsiz - 1] |= 0x80;

    for (i = 0; i < rsizw; i++) {
        st[i] ^= ((uint64_t *) temp)[i];
    }

    keccakf(st, KECCAK_ROUNDS);

    memcpy(md, st, mdlen);
}